

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateSiblings
          (FileGenerator *this,string *package_dir,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list)

{
  int iVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  GeneratorContext *pGVar4;
  bool bVar5;
  int iVar6;
  FileOptions *this_00;
  string *psVar7;
  allocator<char> local_119;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  int local_f4;
  code *pcStack_f0;
  int i_2;
  undefined8 uStack_e8;
  allocator<char> local_d9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  code *local_b8;
  undefined8 uStack_b0;
  allocator<char> local_a1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  int local_7c;
  code *pcStack_78;
  int i_1;
  undefined8 uStack_70;
  allocator<char> local_51;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  int local_2c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_28;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *file_list_local;
  GeneratorContext *context_local;
  string *package_dir_local;
  FileGenerator *this_local;
  
  pvStack_28 = file_list;
  file_list_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)context;
  context_local = (GeneratorContext *)package_dir;
  package_dir_local = (string *)this;
  this_00 = FileDescriptor::options(this->file_);
  bVar5 = FileOptions::java_multiple_files(this_00);
  if (bVar5) {
    for (local_2c = 0; iVar1 = local_2c, iVar6 = FileDescriptor::enum_type_count(this->file_),
        pGVar4 = context_local, iVar1 < iVar6; local_2c = local_2c + 1) {
      psVar7 = (string *)FileDescriptor::enum_type(this->file_,local_2c);
      pvVar3 = file_list_local;
      pvVar2 = pvStack_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
      pcStack_78 = EnumGenerator::Generate;
      uStack_70 = 0;
      GenerateSibling<google::protobuf::compiler::java::EnumGenerator,google::protobuf::EnumDescriptor>
                ((java *)pGVar4,&this->java_package_,psVar7,(EnumDescriptor *)pvVar3,
                 (GeneratorContext *)pvVar2,&local_50,(string *)EnumGenerator::Generate,0);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
    }
    for (local_7c = 0; iVar1 = local_7c, iVar6 = FileDescriptor::message_type_count(this->file_),
        pGVar4 = context_local, iVar1 < iVar6; local_7c = local_7c + 1) {
      psVar7 = (string *)FileDescriptor::message_type(this->file_,local_7c);
      pvVar3 = file_list_local;
      pvVar2 = pvStack_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"OrBuilder",&local_a1);
      local_b8 = MessageGenerator::GenerateInterface;
      uStack_b0 = 0;
      GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                ((java *)pGVar4,&this->java_package_,psVar7,(Descriptor *)pvVar3,
                 (GeneratorContext *)pvVar2,&local_a0,(string *)MessageGenerator::GenerateInterface,
                 0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
      pGVar4 = context_local;
      psVar7 = (string *)FileDescriptor::message_type(this->file_,local_7c);
      pvVar3 = file_list_local;
      pvVar2 = pvStack_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_d9);
      pcStack_f0 = MessageGenerator::Generate;
      uStack_e8 = 0;
      GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                ((java *)pGVar4,&this->java_package_,psVar7,(Descriptor *)pvVar3,
                 (GeneratorContext *)pvVar2,&local_d8,(string *)MessageGenerator::Generate,0);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
    }
    bVar5 = HasGenericServices(this->file_);
    if (bVar5) {
      for (local_f4 = 0; iVar1 = local_f4, iVar6 = FileDescriptor::service_count(this->file_),
          pGVar4 = context_local, iVar1 < iVar6; local_f4 = local_f4 + 1) {
        psVar7 = (string *)FileDescriptor::service(this->file_,local_f4);
        pvVar3 = file_list_local;
        pvVar2 = pvStack_28;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_119);
        GenerateSibling<google::protobuf::compiler::java::ServiceGenerator,google::protobuf::ServiceDescriptor>
                  ((java *)pGVar4,&this->java_package_,psVar7,(ServiceDescriptor *)pvVar3,
                   (GeneratorContext *)pvVar2,&local_118,(string *)ServiceGenerator::Generate,0);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator(&local_119);
      }
    }
  }
  return;
}

Assistant:

void FileGenerator::GenerateSiblings(const string& package_dir,
                                     GeneratorContext* context,
                                     vector<string>* file_list) {
  if (file_->options().java_multiple_files()) {
    for (int i = 0; i < file_->enum_type_count(); i++) {
      GenerateSibling<EnumGenerator>(package_dir, java_package_,
                                     file_->enum_type(i),
                                     context, file_list, "",
                                     &EnumGenerator::Generate);
    }
    for (int i = 0; i < file_->message_type_count(); i++) {
      GenerateSibling<MessageGenerator>(package_dir, java_package_,
                                        file_->message_type(i),
                                        context, file_list, "OrBuilder",
                                        &MessageGenerator::GenerateInterface);
      GenerateSibling<MessageGenerator>(package_dir, java_package_,
                                        file_->message_type(i),
                                        context, file_list, "",
                                        &MessageGenerator::Generate);
    }
    if (HasGenericServices(file_)) {
      for (int i = 0; i < file_->service_count(); i++) {
        GenerateSibling<ServiceGenerator>(package_dir, java_package_,
                                          file_->service(i),
                                          context, file_list, "",
                                          &ServiceGenerator::Generate);
      }
    }
  }
}